

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_run_optimize(roaring_bitmap_t *r)

{
  uint8_t *puVar1;
  shared_container_t *sc;
  container_t *pcVar2;
  void **ppvVar3;
  ulong uVar4;
  _Bool _Var5;
  ulong uVar6;
  ulong uVar7;
  uint8_t type_after;
  uint8_t local_29;
  
  if ((r->high_low_container).size < 1) {
    _Var5 = false;
  }
  else {
    uVar7 = 0;
    _Var5 = false;
    do {
      ppvVar3 = (r->high_low_container).containers;
      puVar1 = (r->high_low_container).typecodes;
      uVar6 = uVar7 & 0xffff;
      sc = (shared_container_t *)ppvVar3[uVar6];
      if (puVar1[uVar6] == '\x04') {
        sc = (shared_container_t *)shared_container_extract_copy(sc,puVar1 + uVar6);
        ppvVar3 = (r->high_low_container).containers;
      }
      uVar4 = (ulong)(uint)((int)uVar6 * 8);
      *(shared_container_t **)((long)ppvVar3 + uVar4) = sc;
      pcVar2 = convert_run_optimize
                         (*(container_t **)((long)(r->high_low_container).containers + uVar4),
                          (r->high_low_container).typecodes[uVar6],&local_29);
      _Var5 = (_Bool)(_Var5 | local_29 == '\x03');
      (r->high_low_container).containers[uVar7] = pcVar2;
      (r->high_low_container).typecodes[uVar7] = local_29;
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)(r->high_low_container).size);
  }
  return _Var5;
}

Assistant:

bool roaring_bitmap_run_optimize(roaring_bitmap_t *r) {
    bool answer = false;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original, type_after;
        ra_unshare_container_at_index(
            &r->high_low_container,
            (uint16_t)i);  // TODO: this introduces extra cloning!
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        container_t *c1 = convert_run_optimize(c, type_original, &type_after);
        if (type_after == RUN_CONTAINER_TYPE) {
            answer = true;
        }
        ra_set_container_at_index(&r->high_low_container, i, c1, type_after);
    }
    return answer;
}